

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::wait_until_socket_is_ready(socket_t sock,time_t sec,time_t usec)

{
  anon_class_40_5_fce8b38b fn;
  int iVar1;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  socklen_t local_1f8;
  int local_1f4;
  socklen_t len;
  int error;
  undefined1 *puStack_1e8;
  __fd_mask *local_1e0;
  __suseconds_t *p_Stack_1d8;
  ssize_t *local_1d0;
  ssize_t local_1c8;
  ssize_t ret;
  timeval tv;
  fd_set fdse;
  fd_set fdsw;
  fd_set *__arr;
  uint __i;
  fd_set fdsr;
  time_t usec_local;
  time_t sec_local;
  socket_t sock_local;
  
  sec_local._0_4_ = sock;
  fdsr.fds_bits[0xf] = usec;
  if (sock < 0x400) {
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      *(undefined8 *)(&stack0xffffffffffffff60 + (ulong)__arr._4_4_ * 8) = 0;
    }
    *(ulong *)(&stack0xffffffffffffff60 + (long)(sock / 0x40) * 8) =
         1L << ((byte)((long)sock % 0x40) & 0x3f) |
         *(ulong *)(&stack0xffffffffffffff60 + (long)(sock / 0x40) * 8);
    memcpy(fdse.fds_bits + 0xf,&stack0xffffffffffffff60,0x80);
    memcpy(&tv.tv_usec,&stack0xffffffffffffff60,0x80);
    tv.tv_sec = fdsr.fds_bits[0xf];
    _len = &sec_local;
    puStack_1e8 = &stack0xffffffffffffff60;
    local_1e0 = fdse.fds_bits + 0xf;
    p_Stack_1d8 = &tv.tv_usec;
    local_1d0 = &ret;
    fn.fdsr = (fd_set *)local_1e0;
    fn.sock = (socket_t *)puStack_1e8;
    fn.fdsw = (fd_set *)p_Stack_1d8;
    fn.fdse = (fd_set *)local_1d0;
    fn.tv._0_7_ = in_stack_fffffffffffffdf0;
    fn.tv._7_1_ = in_stack_fffffffffffffdf7;
    ret = sec;
    local_1c8 = handle_EINTR<httplib::detail::wait_until_socket_is_ready(int,long,long)::_lambda()_1_>
                          (fn);
    if ((local_1c8 < 1) ||
       (((*(ulong *)(&stack0xffffffffffffff60 + (long)((socket_t)sec_local / 0x40) * 8) &
         1L << ((byte)((long)(socket_t)sec_local % 0x40) & 0x3f)) == 0 &&
        ((fdse.fds_bits[(long)((socket_t)sec_local / 0x40) + 0xf] &
         1L << ((byte)((long)(socket_t)sec_local % 0x40) & 0x3f)) == 0)))) {
      sec_local._7_1_ = false;
    }
    else {
      local_1f4 = 0;
      local_1f8 = 4;
      iVar1 = getsockopt((socket_t)sec_local,1,4,&local_1f4,&local_1f8);
      sec_local._7_1_ = -1 < iVar1 && local_1f4 == 0;
    }
  }
  else {
    sec_local._7_1_ = false;
  }
  return sec_local._7_1_;
}

Assistant:

inline bool wait_until_socket_is_ready(socket_t sock, time_t sec, time_t usec) {
#ifdef CPPHTTPLIB_USE_POLL
			struct pollfd pfd_read;
  pfd_read.fd = sock;
  pfd_read.events = POLLIN | POLLOUT;

  auto timeout = static_cast<int>(sec * 1000 + usec / 1000);

  auto poll_res = handle_EINTR([&]() { return poll(&pfd_read, 1, timeout); });

  if (poll_res > 0 && pfd_read.revents & (POLLIN | POLLOUT)) {
    int error = 0;
    socklen_t len = sizeof(error);
    auto res = getsockopt(sock, SOL_SOCKET, SO_ERROR,
                          reinterpret_cast<char *>(&error), &len);
    return res >= 0 && !error;
  }
  return false;
#else
#ifndef _WIN32
			if (sock >= FD_SETSIZE) { return false; }
#endif

			fd_set fdsr;
			FD_ZERO(&fdsr);
			FD_SET(sock, &fdsr);

			auto fdsw = fdsr;
			auto fdse = fdsr;

			timeval tv;
			tv.tv_sec = static_cast<long>(sec);
			tv.tv_usec = static_cast<decltype(tv.tv_usec)>(usec);

			auto ret = handle_EINTR([&]() {
				return select(static_cast<int>(sock + 1), &fdsr, &fdsw, &fdse, &tv);
			});

			if (ret > 0 && (FD_ISSET(sock, &fdsr) || FD_ISSET(sock, &fdsw))) {
				int error = 0;
				socklen_t len = sizeof(error);
				return getsockopt(sock, SOL_SOCKET, SO_ERROR,
								  reinterpret_cast<char *>(&error), &len) >= 0 &&
					   !error;
			}
			return false;
#endif
		}